

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QColorListView.cpp
# Opt level: O0

void QColorListView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  NameFormat *pNVar1;
  NameFormat NVar2;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  void *_v_1;
  QColorListView *_t_1;
  void *_v;
  QColorListView *_t;
  undefined4 in_stack_ffffffffffffffa8;
  NameFormat in_stack_ffffffffffffffac;
  QList<QString> *in_stack_ffffffffffffffb0;
  
  if (in_ESI == 1) {
    pNVar1 = (NameFormat *)*in_RCX;
    if (in_EDX == 0) {
      NVar2 = nameFormat((QColorListView *)0x1d56f7);
      *pNVar1 = NVar2;
    }
    else if (in_EDX == 1) {
      colorNames((QColorListView *)CONCAT44(1,in_stack_ffffffffffffffa8));
      QList<QString>::operator=
                (in_stack_ffffffffffffffb0,
                 (QList<QString> *)CONCAT44(in_EDX,in_stack_ffffffffffffffa8));
      QList<QString>::~QList((QList<QString> *)0x1d572a);
    }
  }
  else if (in_ESI == 2) {
    if (in_EDX == 0) {
      setNameFormat((QColorListView *)*in_RCX,in_stack_ffffffffffffffac);
    }
    else if (in_EDX == 1) {
      setColorNames((QColorListView *)*in_RCX,(QStringList *)CONCAT44(in_stack_ffffffffffffffac,1));
    }
  }
  return;
}

Assistant:

void QColorListView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QColorListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QColorListModel::NameFormat*>(_v) = _t->nameFormat(); break;
        case 1: *reinterpret_cast< QStringList*>(_v) = _t->colorNames(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QColorListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNameFormat(*reinterpret_cast< QColorListModel::NameFormat*>(_v)); break;
        case 1: _t->setColorNames(*reinterpret_cast< QStringList*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}